

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktInfoTests.cpp
# Opt level: O0

string * __thiscall
vkt::(anonymous_namespace)::getCompilerName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int compiler)

{
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  int compiler_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DE_COMPILER_VANILLA",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DE_COMPILER_MSC",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DE_COMPILER_GCC",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DE_COMPILER_CLANG",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  default:
    de::toString<int>(__return_storage_ptr__,&local_14);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getCompilerName (int compiler)
{
	switch (compiler)
	{
		case DE_COMPILER_VANILLA:	return "DE_COMPILER_VANILLA";
		case DE_COMPILER_MSC:		return "DE_COMPILER_MSC";
		case DE_COMPILER_GCC:		return "DE_COMPILER_GCC";
		case DE_COMPILER_CLANG:		return "DE_COMPILER_CLANG";
		default:
			return de::toString(compiler);
	}
}